

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

aom_codec_err_t
av1_get_seq_level_idx(SequenceHeader *seq_params,AV1LevelParams *level_params,int *seq_level_idx)

{
  byte bVar1;
  BITSTREAM_PROFILE profile;
  byte bVar2;
  AV1LevelInfo *level_info;
  bool bVar3;
  TARGET_LEVEL_FAIL_ID TVar4;
  int level;
  uint uVar5;
  long lVar6;
  
  if (-1 < seq_params->operating_points_cnt_minus_1) {
    bVar1 = seq_params->still_picture;
    profile = seq_params->profile;
    lVar6 = 0;
    do {
      seq_level_idx[lVar6] = 0x1f;
      if ((level_params->keep_level_stats >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        bVar2 = seq_params->tier[lVar6];
        level_info = level_params->level_info[lVar6];
        uVar5 = 0;
        do {
          if ((((((byte)uVar5 & 0x1a) != 2) && (6 < (uVar5 & 0xff) - 0x14)) &&
              (1 < (uVar5 & 0xff) - 10)) &&
             ((uVar5 != 0x1b &&
              (TVar4 = check_level_constraints
                                 (level_info,(byte)uVar5,(uint)bVar2,(uint)bVar1,profile,1),
              TVar4 == TARGET_LEVEL_OK)))) {
            seq_level_idx[lVar6] = uVar5;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x1c);
      }
      bVar3 = lVar6 < seq_params->operating_points_cnt_minus_1;
      lVar6 = lVar6 + 1;
    } while (bVar3);
  }
  return AOM_CODEC_OK;
}

Assistant:

aom_codec_err_t av1_get_seq_level_idx(const SequenceHeader *seq_params,
                                      const AV1LevelParams *level_params,
                                      int *seq_level_idx) {
  const int is_still_picture = seq_params->still_picture;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  for (int op = 0; op < seq_params->operating_points_cnt_minus_1 + 1; ++op) {
    seq_level_idx[op] = (int)SEQ_LEVEL_MAX;
    if (!((level_params->keep_level_stats >> op) & 1)) continue;
    const int tier = seq_params->tier[op];
    const AV1LevelInfo *const level_info = level_params->level_info[op];
    assert(level_info != NULL);
    for (int level = 0; level < SEQ_LEVELS; ++level) {
      if (!is_valid_seq_level_idx(level)) continue;
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, level, tier, is_still_picture, profile, 1);
      if (fail_id == TARGET_LEVEL_OK) {
        seq_level_idx[op] = level;
        break;
      }
    }
  }

  return AOM_CODEC_OK;
}